

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.cc
# Opt level: O1

void __thiscall SleighBase::saveXml(SleighBase *this,ostream *s)

{
  bool bVar1;
  AddrSpace *pAVar2;
  ostream *poVar3;
  pointer ppAVar4;
  char *pcVar5;
  long lVar6;
  char local_51;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<sleigh",7);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"version","");
  local_51 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"bigendian","");
  bVar1 = (this->super_Translate).target_isbigendian;
  local_51 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
  pcVar5 = "false";
  if (bVar1 != false) {
    pcVar5 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar5,(ulong)bVar1 ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"align","");
  local_51 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"uniqbase","");
  local_51 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"0x",4);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (this->maxdelayslotbytes != 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"maxdelay","");
    local_51 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"0x",4);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  if (this->unique_allocatemask != 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"uniqmask","");
    local_51 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"0x",4);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  if (this->numSections != 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"numsections","");
    local_51 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"0x",4);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"<spaces",7);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"defaultspace","");
  pAVar2 = (this->super_Translate).super_AddrSpaceManager.defaultspace;
  local_51 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_51,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
  xml_escape(s,(pAVar2->name)._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  ppAVar4 = (this->super_Translate).super_AddrSpaceManager.baselist.
            super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->super_Translate).super_AddrSpaceManager.baselist.
                              super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppAVar4) >> 3)) {
    lVar6 = 0;
    do {
      pAVar2 = ppAVar4[lVar6];
      if ((pAVar2 != (AddrSpace *)0x0) &&
         ((IPTR_JOIN < pAVar2->type || ((0x71U >> (pAVar2->type & 0x1f) & 1) == 0)))) {
        (*pAVar2->_vptr_AddrSpace[0xc])(pAVar2,s);
      }
      lVar6 = lVar6 + 1;
      ppAVar4 = (this->super_Translate).super_AddrSpaceManager.baselist.
                super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(this->super_Translate).super_AddrSpaceManager.baselist.
                                         super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4)
                          >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</spaces>\n",10);
  SymbolTable::saveXml(&this->symtab,s);
  std::__ostream_insert<char,std::char_traits<char>>(s,"</sleigh>\n",10);
  return;
}

Assistant:

void SleighBase::saveXml(ostream &s) const

{
  s << "<sleigh";
  a_v_i(s,"version",SLA_FORMAT_VERSION);
  a_v_b(s,"bigendian",isBigEndian());
  a_v_i(s,"align",alignment);
  a_v_u(s,"uniqbase",getUniqueBase());
  if (maxdelayslotbytes > 0)
    a_v_u(s,"maxdelay",maxdelayslotbytes);
  if (unique_allocatemask != 0)
    a_v_u(s,"uniqmask",unique_allocatemask);
  if (numSections != 0)
    a_v_u(s,"numsections",numSections);
  s << ">\n";

  s << "<spaces";
  a_v(s,"defaultspace",getDefaultSpace()->getName());
  s << ">\n";
  for(int4 i=0;i<numSpaces();++i) {
    AddrSpace *spc = getSpace(i);
    if (spc == (AddrSpace *)0) continue;
    if ((spc->getType()==IPTR_CONSTANT) || 
	(spc->getType()==IPTR_FSPEC)||
	(spc->getType()==IPTR_IOP)||
	(spc->getType()==IPTR_JOIN))
      continue;
    spc->saveXml(s);
  }
  s << "</spaces>\n";
  symtab.saveXml(s);
  s << "</sleigh>\n";
}